

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

natwm_error event_handle(natwm_state *state,xcb_generic_event_t *event)

{
  xcb_window_t xVar1;
  xcb_ewmh_connection_t *pxVar2;
  xcb_rectangle_t *pxVar3;
  byte event_type;
  _Bool _Var4;
  natwm_error nVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  
  event_type = event->response_type & 0x7f;
  switch(event_type) {
  case 0x11:
    nVar5 = client_handle_destroy_notify(state,event->pad[1]);
    return nVar5;
  case 0x12:
    client_unmap_window(state,event->pad[1]);
    break;
  case 0x13:
    client_handle_map_notify(state,event->pad[1]);
    break;
  case 0x14:
    xVar1 = event->pad[1];
    _Var4 = ewmh_is_normal_window(state,xVar1);
    if (_Var4) {
      client_register_window(state,xVar1);
    }
    else {
      xcb_map_window(state->xcb,xVar1);
    }
    break;
  case 0x15:
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x20:
switchD_0010753b_caseD_15:
    if (state->monitor_list->extension->type != RANDR) {
      return NOT_FOUND_ERROR;
    }
    nVar5 = handle_randr_event(state,event,event_type);
    return nVar5;
  case 0x17:
    nVar5 = client_configure_window(state,(xcb_configure_request_event_t *)event);
    return nVar5;
  case 0x1b:
    xcb_circulate_window(state->xcb,(char)event->pad[3],event->pad[1]);
    break;
  case 0x21:
    if (event->pad0 != ' ') {
      return NO_ERROR;
    }
    xVar1 = event->pad[0];
    uVar8 = event->pad[1];
    pxVar2 = state->ewmh;
    if (uVar8 == pxVar2->_NET_ACTIVE_WINDOW) {
      nVar5 = client_focus_window(state,xVar1);
      return nVar5;
    }
    if (uVar8 == pxVar2->_NET_CLOSE_WINDOW) {
      xcb_destroy_window(state->xcb,xVar1);
      return NO_ERROR;
    }
    if (uVar8 != pxVar2->_NET_CURRENT_DESKTOP) {
      if (uVar8 == pxVar2->_NET_WM_DESKTOP) {
        nVar5 = client_send_window_to_workspace(state,xVar1,(ulong)event->pad[2]);
        return nVar5;
      }
      if (uVar8 != pxVar2->_NET_WM_STATE) {
        return NO_ERROR;
      }
      uVar8 = event->pad[3];
      if (uVar8 == 0x40) {
        uVar8 = event->pad[4];
      }
      if (uVar8 != pxVar2->_NET_WM_STATE_FULLSCREEN) {
        return NO_ERROR;
      }
      nVar5 = client_handle_fullscreen_window(state,event->pad[2],xVar1);
      return nVar5;
    }
    nVar5 = workspace_list_switch_to_workspace(state,(ulong)event->pad[2]);
    return nVar5;
  default:
    if (event_type == 6) {
      if (*(char *)((long)event->pad + 0x1a) == '\0') {
        internal_logger(natwm_logger,LEVEL_ERROR,
                        "Receieved a motion event which did not occur on the root window");
        return INVALID_INPUT_ERROR;
      }
      pxVar3 = state->button_state->monitor_rect;
      uVar6 = (int)(short)event->pad[4] - (int)pxVar3->x;
      uVar7 = (int)*(short *)((long)event->pad + 0x12) - (int)pxVar3->y;
      if ((int)(uVar6 | uVar7) < 0) {
        return NO_ERROR;
      }
      if (pxVar3->width < uVar6) {
        return NO_ERROR;
      }
      if (pxVar3->height < uVar7) {
        return NO_ERROR;
      }
      nVar5 = button_handle_motion
                        (state,(uint16_t)event->pad[6],(int16_t)event->pad[5],
                         *(int16_t *)((long)event->pad + 0x16));
      return nVar5;
    }
    if (event_type != 5) {
      if (event_type == 4) {
        nVar5 = client_handle_button_press(state,(xcb_button_press_event_t *)event);
        return nVar5;
      }
      goto switchD_0010753b_caseD_15;
    }
    if (event->pad0 == '\x03') {
      nVar5 = button_handle_resize_end(state,(xcb_button_release_event_t *)event);
      return nVar5;
    }
    if (event->pad0 == '\x01') {
      button_handle_drag_end(state);
    }
    else {
      internal_logger(natwm_logger,LEVEL_WARNING,"Received invalid button release event - ignoring")
      ;
    }
  }
  return NO_ERROR;
}

Assistant:

enum natwm_error event_handle(struct natwm_state *state, xcb_generic_event_t *event)
{
        uint8_t type = (uint8_t)(GET_EVENT_TYPE(event->response_type));

        switch (type) {
        case XCB_BUTTON_PRESS:
                return client_handle_button_press(state, (xcb_button_press_event_t *)event);
        case XCB_BUTTON_RELEASE:
                return event_handle_button_release(state, (xcb_button_release_event_t *)event);
        case XCB_CLIENT_MESSAGE:
                return event_handle_client_message(state, (xcb_client_message_event_t *)event);
        case XCB_CONFIGURE_REQUEST:
                return event_handle_configure_request(state,
                                                      (xcb_configure_request_event_t *)event);
        case XCB_CIRCULATE_REQUEST:
                return event_handle_circulate_request(state,
                                                      (xcb_circulate_request_event_t *)event);
        case XCB_DESTROY_NOTIFY:
                return event_handle_destroy_notify(state, (xcb_destroy_notify_event_t *)event);
        case XCB_MAP_REQUEST:
                return event_handle_map_request(state, (xcb_map_request_event_t *)event);
        case XCB_MAP_NOTIFY:
                return event_handle_map_notify(state, (xcb_map_notify_event_t *)event);
        case XCB_MOTION_NOTIFY:
                return event_handle_motion_notify(state, (xcb_motion_notify_event_t *)event);
        case XCB_UNMAP_NOTIFY:
                return event_handle_unmap_notify(state, (xcb_unmap_notify_event_t *)event);
        }

        // If we support randr events we handle those here too
        if (state->monitor_list->extension->type == RANDR) {
                return handle_randr_event(state, event, type);
        }

        return NOT_FOUND_ERROR;
}